

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O3

bool __thiscall
glslang::HlslGrammar::acceptLayoutQualifierList(HlslGrammar *this,TQualifier *qualifier)

{
  bool bVar1;
  char *pcVar2;
  HlslParseContext *this_00;
  _func_int **pp_Var3;
  TIntermTyped *expr;
  TIntermTyped *local_60;
  HlslToken local_58;
  
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLayout);
  if ((!bVar1) ||
     (bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen), !bVar1
     )) {
    return false;
  }
  local_58.field_2.string = (TString *)0x0;
  local_58.loc.name = (TString *)0x0;
  local_58.loc.string = 0;
  local_58.loc.line = 0;
  local_58.loc.column = 0;
  bVar1 = acceptIdentifier(this,&local_58);
  if (bVar1) {
    do {
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokAssign);
      if (bVar1) {
        bVar1 = acceptConditionalExpression(this,&local_60);
        this_00 = this->parseContext;
        if (!bVar1) {
          pp_Var3 = (this_00->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar2 = "expression";
          goto LAB_003a1b73;
        }
        HlslParseContext::setLayoutQualifier
                  (this_00,&local_58.loc,qualifier,local_58.field_2.string,local_60);
      }
      else {
        HlslParseContext::setLayoutQualifier
                  (this->parseContext,&local_58.loc,qualifier,local_58.field_2.string);
      }
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
      if (!bVar1) break;
      local_58.field_2.string = (TString *)0x0;
      local_58.loc.name = (TString *)0x0;
      local_58.loc.string = 0;
      local_58.loc.line = 0;
      local_58.loc.column = 0;
      bVar1 = acceptIdentifier(this,&local_58);
    } while (bVar1);
  }
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
  if (bVar1) {
    return true;
  }
  this_00 = this->parseContext;
  pp_Var3 = (this_00->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
  pcVar2 = ")";
LAB_003a1b73:
  (*pp_Var3[0x2d])(this_00,&(this->super_HlslTokenStream).token,"Expected",pcVar2,"");
  return false;
}

Assistant:

bool HlslGrammar::acceptLayoutQualifierList(TQualifier& qualifier)
{
    if (! acceptTokenClass(EHTokLayout))
        return false;

    // LEFT_PAREN
    if (! acceptTokenClass(EHTokLeftParen))
        return false;

    do {
        // identifier
        HlslToken idToken;
        if (! acceptIdentifier(idToken))
            break;

        // EQUAL expression
        if (acceptTokenClass(EHTokAssign)) {
            TIntermTyped* expr;
            if (! acceptConditionalExpression(expr)) {
                expected("expression");
                return false;
            }
            parseContext.setLayoutQualifier(idToken.loc, qualifier, *idToken.string, expr);
        } else
            parseContext.setLayoutQualifier(idToken.loc, qualifier, *idToken.string);

        // COMMA
        if (! acceptTokenClass(EHTokComma))
            break;
    } while (true);

    // RIGHT_PAREN
    if (! acceptTokenClass(EHTokRightParen)) {
        expected(")");
        return false;
    }

    return true;
}